

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined6 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  uint in_R9D;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint in_stack_00000008;
  int offset_4;
  int offset_3;
  int offset_2;
  int offset_1;
  int offset;
  __m128i control_mask_4_8x16b;
  __m128i control_mask_3_8x16b;
  __m128i control_mask_2_8x16b;
  __m128i control_mask_1_8x16b;
  __m128i coeff6_7_8x16b;
  __m128i coeff4_5_8x16b;
  __m128i coeff2_3_8x16b;
  __m128i coeff0_1_8x16b;
  __m128i res_temp18_8x16b;
  __m128i res_temp17_8x16b;
  __m128i res_temp16_8x16b;
  __m128i res_temp15_8x16b;
  __m128i res_temp14_8x16b;
  __m128i res_temp13_8x16b;
  __m128i res_temp12_8x16b;
  __m128i res_temp11_8x16b;
  __m128i res_temp8_8x16b;
  __m128i res_temp7_8x16b;
  __m128i res_temp6_8x16b;
  __m128i res_temp5_8x16b;
  __m128i res_temp4_8x16b;
  __m128i res_temp3_8x16b;
  __m128i res_temp2_8x16b;
  __m128i res_temp1_8x16b;
  __m128i src_temp16_16x8b;
  __m128i src_temp15_16x8b;
  __m128i src_temp14_16x8b;
  __m128i src_temp13_16x8b;
  __m128i src_temp12_16x8b;
  __m128i src_temp11_16x8b;
  __m128i src_temp6_16x8b;
  __m128i src_temp5_16x8b;
  __m128i src_temp4_16x8b;
  __m128i src_temp3_16x8b;
  __m128i src_temp2_16x8b;
  __m128i src_temp1_16x8b;
  __m128i mask_high_96b;
  __m128i mask_low_32b;
  __m128i offset_8x16b;
  __m128i zero_8x16b;
  WORD32 col;
  WORD32 row;
  int local_161c;
  int local_1618;
  int local_1614;
  int local_1610;
  int local_160c;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined1 uStack_14d6;
  undefined1 uStack_14d5;
  undefined1 uStack_14d4;
  undefined1 uStack_14d3;
  undefined1 uStack_14d2;
  undefined1 uStack_14d1;
  undefined1 uStack_14ce;
  undefined1 uStack_14cd;
  undefined1 uStack_14cc;
  undefined1 uStack_14cb;
  undefined1 uStack_14ca;
  undefined1 uStack_14c9;
  int local_1384;
  int local_1380;
  long local_1368;
  long local_1360;
  undefined1 uStack_10a1;
  undefined1 uStack_1091;
  undefined1 uStack_1081;
  undefined1 uStack_1071;
  undefined1 uStack_1061;
  undefined1 uStack_1051;
  undefined1 local_1048;
  undefined1 uStack_1047;
  undefined1 uStack_1046;
  undefined1 uStack_1045;
  undefined1 uStack_1044;
  undefined1 uStack_1043;
  undefined1 uStack_1042;
  undefined1 uStack_1041;
  undefined1 local_1038;
  undefined1 uStack_1037;
  undefined1 uStack_1036;
  undefined1 uStack_1035;
  undefined1 uStack_1034;
  undefined1 uStack_1033;
  undefined1 uStack_1032;
  undefined1 uStack_1031;
  undefined1 uStack_1021;
  undefined1 uStack_1011;
  undefined1 uStack_1001;
  undefined1 uStack_ff1;
  undefined1 uStack_fe1;
  undefined1 uStack_fd1;
  undefined1 local_fc8;
  undefined1 uStack_fc7;
  undefined1 uStack_fc6;
  undefined1 uStack_fc5;
  undefined1 uStack_fc4;
  undefined1 uStack_fc3;
  undefined1 uStack_fc2;
  undefined1 uStack_fc1;
  undefined1 local_fb8;
  undefined1 uStack_fb7;
  undefined1 uStack_fb6;
  undefined1 uStack_fb5;
  undefined1 uStack_fb4;
  undefined1 uStack_fb3;
  undefined1 uStack_fb2;
  undefined1 uStack_fb1;
  undefined1 uStack_fa1;
  undefined1 uStack_f91;
  undefined1 uStack_f81;
  undefined1 uStack_f71;
  undefined1 uStack_f61;
  undefined1 uStack_f51;
  undefined1 local_f48;
  undefined1 uStack_f47;
  undefined1 uStack_f46;
  undefined1 uStack_f45;
  undefined1 uStack_f44;
  undefined1 uStack_f43;
  undefined1 uStack_f42;
  undefined1 uStack_f41;
  undefined1 local_f38;
  undefined1 uStack_f37;
  undefined1 uStack_f36;
  undefined1 uStack_f35;
  undefined1 uStack_f34;
  undefined1 uStack_f33;
  undefined1 uStack_f32;
  undefined1 uStack_f31;
  undefined1 uStack_f21;
  undefined1 uStack_f11;
  undefined1 uStack_f01;
  undefined1 uStack_ef1;
  undefined1 uStack_ee1;
  undefined1 uStack_ed1;
  undefined1 local_ec8;
  undefined1 uStack_ec7;
  undefined1 uStack_ec6;
  undefined1 uStack_ec5;
  undefined1 uStack_ec4;
  undefined1 uStack_ec3;
  undefined1 uStack_ec2;
  undefined1 uStack_ec1;
  undefined1 local_eb8;
  undefined1 uStack_eb7;
  undefined1 uStack_eb6;
  undefined1 uStack_eb5;
  undefined1 uStack_eb4;
  undefined1 uStack_eb3;
  undefined1 uStack_eb2;
  undefined1 uStack_eb1;
  undefined1 uStack_ea1;
  undefined1 uStack_e91;
  undefined1 uStack_e81;
  undefined1 uStack_e71;
  undefined1 uStack_e61;
  undefined1 uStack_e51;
  undefined1 local_e48;
  undefined1 uStack_e47;
  undefined1 uStack_e46;
  undefined1 uStack_e45;
  undefined1 uStack_e44;
  undefined1 uStack_e43;
  undefined1 uStack_e42;
  undefined1 uStack_e41;
  undefined1 local_e38;
  undefined1 uStack_e37;
  undefined1 uStack_e36;
  undefined1 uStack_e35;
  undefined1 uStack_e34;
  undefined1 uStack_e33;
  undefined1 uStack_e32;
  undefined1 uStack_e31;
  undefined1 uStack_e21;
  undefined1 uStack_e11;
  undefined1 uStack_e01;
  undefined1 uStack_df1;
  undefined1 uStack_de1;
  undefined1 uStack_dd1;
  undefined1 local_dc8;
  undefined1 uStack_dc7;
  undefined1 uStack_dc6;
  undefined1 uStack_dc5;
  undefined1 uStack_dc4;
  undefined1 uStack_dc3;
  undefined1 uStack_dc2;
  undefined1 uStack_dc1;
  undefined1 local_db8;
  undefined1 uStack_db7;
  undefined1 uStack_db6;
  undefined1 uStack_db5;
  undefined1 uStack_db4;
  undefined1 uStack_db3;
  undefined1 uStack_db2;
  undefined1 uStack_db1;
  undefined1 uStack_da1;
  undefined1 uStack_d91;
  undefined1 uStack_d81;
  undefined1 uStack_d71;
  undefined1 uStack_d61;
  undefined1 uStack_d51;
  undefined1 local_d48;
  undefined1 uStack_d47;
  undefined1 uStack_d46;
  undefined1 uStack_d45;
  undefined1 uStack_d44;
  undefined1 uStack_d43;
  undefined1 uStack_d42;
  undefined1 uStack_d41;
  undefined1 local_d38;
  undefined1 uStack_d37;
  undefined1 uStack_d36;
  undefined1 uStack_d35;
  undefined1 uStack_d34;
  undefined1 uStack_d33;
  undefined1 uStack_d32;
  undefined1 uStack_d31;
  undefined1 uStack_d21;
  undefined1 uStack_d11;
  undefined1 uStack_d01;
  undefined1 uStack_cf1;
  undefined1 uStack_ce1;
  undefined1 uStack_cd1;
  undefined1 local_cc8;
  undefined1 uStack_cc7;
  undefined1 uStack_cc6;
  undefined1 uStack_cc5;
  undefined1 uStack_cc4;
  undefined1 uStack_cc3;
  undefined1 uStack_cc2;
  undefined1 uStack_cc1;
  undefined1 local_cb8;
  undefined1 uStack_cb7;
  undefined1 uStack_cb6;
  undefined1 uStack_cb5;
  undefined1 uStack_cb4;
  undefined1 uStack_cb3;
  undefined1 uStack_cb2;
  undefined1 uStack_cb1;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short sStack_870;
  short sStack_86e;
  short sStack_86c;
  short sStack_86a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short sStack_800;
  short sStack_7fe;
  short sStack_7fc;
  short sStack_7fa;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_798;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_790;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_698;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_690;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_648;
  short sStack_646;
  short sStack_644;
  short sStack_642;
  short sStack_640;
  short sStack_63e;
  short sStack_63c;
  short sStack_63a;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_630;
  short sStack_62e;
  short sStack_62c;
  short sStack_62a;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_610;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_5e8;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5e0;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  short local_5d8;
  short sStack_5d6;
  short sStack_5d4;
  short sStack_5d2;
  short sStack_5d0;
  short sStack_5ce;
  short sStack_5cc;
  short sStack_5ca;
  short local_5c8;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short sStack_5c0;
  short sStack_5be;
  short sStack_5bc;
  short sStack_5ba;
  short local_5b8;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5b0;
  short sStack_5ae;
  short sStack_5ac;
  short sStack_5aa;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  
  if ((int)in_stack_00000008 % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x11a,
                  "void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  uVar55 = *in_R8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar55;
  auVar56._8_8_ = 0x100010001000100;
  auVar56._0_8_ = 0x100010001000100;
  auVar56 = pshufb(auVar61,auVar56);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar55;
  auVar57._8_8_ = 0x302030203020302;
  auVar57._0_8_ = 0x302030203020302;
  auVar57 = pshufb(auVar60,auVar57);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar55;
  auVar58._8_8_ = 0x504050405040504;
  auVar58._0_8_ = 0x504050405040504;
  auVar58 = pshufb(auVar64,auVar58);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar55;
  auVar59._8_8_ = 0x706070607060706;
  auVar59._0_8_ = 0x706070607060706;
  auVar59 = pshufb(auVar63,auVar59);
  local_1368 = in_RSI;
  local_1360 = in_RDI;
  if ((in_R9D & 1) == 0) {
    if ((in_stack_00000008 & 7) == 0) {
      for (local_1380 = 0; local_1380 < (int)in_R9D; local_1380 = local_1380 + 2) {
        local_160c = 0;
        for (local_1384 = 0; local_1384 < (int)in_stack_00000008; local_1384 = local_1384 + 8) {
          pauVar1 = (undefined1 (*) [16])(local_1360 + -3 + (long)local_160c);
          uVar2 = *(undefined8 *)*pauVar1;
          auVar63 = *pauVar1;
          pauVar1 = (undefined1 (*) [16])((long)local_160c + -3 + local_1360 + in_EDX);
          uVar3 = *(undefined8 *)*pauVar1;
          auVar64 = *pauVar1;
          local_cb8 = (undefined1)uVar2;
          uStack_cb7 = (undefined1)((ulong)uVar2 >> 8);
          uStack_cb6 = (undefined1)((ulong)uVar2 >> 0x10);
          uStack_cb5 = (undefined1)((ulong)uVar2 >> 0x18);
          uStack_cb4 = (undefined1)((ulong)uVar2 >> 0x20);
          uStack_cb3 = (undefined1)((ulong)uVar2 >> 0x28);
          uStack_cb2 = (undefined1)((ulong)uVar2 >> 0x30);
          uStack_cb1 = (undefined1)((ulong)uVar2 >> 0x38);
          local_cc8 = auVar63[1];
          uStack_cc7 = auVar63[2];
          uStack_cc6 = auVar63[3];
          uStack_cc5 = auVar63[4];
          uStack_cc4 = auVar63[5];
          uStack_cc3 = auVar63[6];
          uStack_cc2 = auVar63[7];
          uStack_cc1 = auVar63[8];
          auVar38[1] = local_cc8;
          auVar38[0] = local_cb8;
          auVar38[2] = uStack_cb7;
          auVar38[3] = uStack_cc7;
          auVar38[4] = uStack_cb6;
          auVar38[5] = uStack_cc6;
          auVar38[6] = uStack_cb5;
          auVar38[7] = uStack_cc5;
          auVar38[9] = uStack_cc4;
          auVar38[8] = uStack_cb4;
          auVar38[10] = uStack_cb3;
          auVar38[0xb] = uStack_cc3;
          auVar38[0xc] = uStack_cb2;
          auVar38[0xd] = uStack_cc2;
          auVar38[0xe] = uStack_cb1;
          auVar38[0xf] = uStack_cc1;
          auVar60 = pmaddubsw(auVar38,auVar56);
          uStack_cd1 = auVar63[9];
          uStack_ce1 = auVar63[10];
          auVar37[2] = uStack_cc6;
          auVar37._0_2_ = auVar63._2_2_;
          auVar37[3] = uStack_cc5;
          auVar37[4] = uStack_cc5;
          auVar37[5] = uStack_cc4;
          auVar37[6] = uStack_cc4;
          auVar37[7] = uStack_cc3;
          auVar37[10] = uStack_cc2;
          auVar37._8_2_ = auVar63._6_2_;
          auVar37[0xb] = uStack_cc1;
          auVar37[0xc] = uStack_cc1;
          auVar37[0xd] = uStack_cd1;
          auVar37[0xe] = uStack_cd1;
          auVar37[0xf] = uStack_ce1;
          auVar61 = pmaddubsw(auVar37,auVar57);
          uStack_cf1 = auVar63[0xb];
          uStack_d01 = auVar63[0xc];
          auVar36[2] = uStack_cc4;
          auVar36._0_2_ = auVar63._4_2_;
          auVar36[3] = uStack_cc3;
          auVar36[4] = uStack_cc3;
          auVar36[5] = uStack_cc2;
          auVar36[6] = uStack_cc2;
          auVar36[7] = uStack_cc1;
          auVar36[10] = uStack_cd1;
          auVar36._8_2_ = auVar63._8_2_;
          auVar36[0xb] = uStack_ce1;
          auVar36[0xc] = uStack_ce1;
          auVar36[0xd] = uStack_cf1;
          auVar36[0xe] = uStack_cf1;
          auVar36[0xf] = uStack_d01;
          auVar62 = pmaddubsw(auVar36,auVar58);
          uStack_d11 = auVar63[0xd];
          uStack_d21 = auVar63[0xe];
          auVar35[2] = uStack_cc2;
          auVar35._0_2_ = auVar63._6_2_;
          auVar35[3] = uStack_cc1;
          auVar35[4] = uStack_cc1;
          auVar35[5] = uStack_cd1;
          auVar35[6] = uStack_cd1;
          auVar35[7] = uStack_ce1;
          auVar35[10] = uStack_cf1;
          auVar35._8_2_ = auVar63._10_2_;
          auVar35[0xb] = uStack_d01;
          auVar35[0xc] = uStack_d01;
          auVar35[0xd] = uStack_d11;
          auVar35[0xe] = uStack_d11;
          auVar35[0xf] = uStack_d21;
          auVar63 = pmaddubsw(auVar35,auVar59);
          local_5b8 = auVar60._0_2_;
          sStack_5b6 = auVar60._2_2_;
          sStack_5b4 = auVar60._4_2_;
          sStack_5b2 = auVar60._6_2_;
          sStack_5b0 = auVar60._8_2_;
          sStack_5ae = auVar60._10_2_;
          sStack_5ac = auVar60._12_2_;
          sStack_5aa = auVar60._14_2_;
          local_5c8 = auVar61._0_2_;
          sStack_5c6 = auVar61._2_2_;
          sStack_5c4 = auVar61._4_2_;
          sStack_5c2 = auVar61._6_2_;
          sStack_5c0 = auVar61._8_2_;
          sStack_5be = auVar61._10_2_;
          sStack_5bc = auVar61._12_2_;
          sStack_5ba = auVar61._14_2_;
          uStack_14d6 = (undefined1)(sStack_5b6 + sStack_5c6);
          uStack_14d5 = (undefined1)((ushort)(sStack_5b6 + sStack_5c6) >> 8);
          uStack_14d4 = (undefined1)(sStack_5b4 + sStack_5c4);
          uStack_14d3 = (undefined1)((ushort)(sStack_5b4 + sStack_5c4) >> 8);
          uStack_14d2 = (undefined1)(sStack_5b2 + sStack_5c2);
          uStack_14d1 = (undefined1)((ushort)(sStack_5b2 + sStack_5c2) >> 8);
          uStack_14ce = (undefined1)(sStack_5ae + sStack_5be);
          uStack_14cd = (undefined1)((ushort)(sStack_5ae + sStack_5be) >> 8);
          uStack_14cc = (undefined1)(sStack_5ac + sStack_5bc);
          uStack_14cb = (undefined1)((ushort)(sStack_5ac + sStack_5bc) >> 8);
          uStack_14ca = (undefined1)(sStack_5aa + sStack_5ba);
          uStack_14c9 = (undefined1)((ushort)(sStack_5aa + sStack_5ba) >> 8);
          local_5d8 = auVar62._0_2_;
          sStack_5d6 = auVar62._2_2_;
          sStack_5d4 = auVar62._4_2_;
          sStack_5d2 = auVar62._6_2_;
          sStack_5d0 = auVar62._8_2_;
          sStack_5ce = auVar62._10_2_;
          sStack_5cc = auVar62._12_2_;
          sStack_5ca = auVar62._14_2_;
          local_5e8 = auVar63._0_2_;
          sStack_5e6 = auVar63._2_2_;
          sStack_5e4 = auVar63._4_2_;
          sStack_5e2 = auVar63._6_2_;
          sStack_5e0 = auVar63._8_2_;
          sStack_5de = auVar63._10_2_;
          sStack_5dc = auVar63._12_2_;
          sStack_5da = auVar63._14_2_;
          uVar4 = CONCAT13(uStack_14d5,CONCAT12(uStack_14d6,local_5b8 + local_5c8));
          uVar5 = CONCAT15(uStack_14d3,CONCAT14(uStack_14d4,uVar4));
          uVar6 = CONCAT13(uStack_14cd,CONCAT12(uStack_14ce,sStack_5b0 + sStack_5c0));
          uVar7 = CONCAT15(uStack_14cb,CONCAT14(uStack_14cc,uVar6));
          sStack_5f6 = (short)((uint)uVar4 >> 0x10);
          sStack_5f4 = (short)((uint6)uVar5 >> 0x20);
          sStack_5f2 = (short)(CONCAT17(uStack_14d1,CONCAT16(uStack_14d2,uVar5)) >> 0x30);
          sStack_5ee = (short)((uint)uVar6 >> 0x10);
          sStack_5ec = (short)((uint6)uVar7 >> 0x20);
          sStack_5ea = (short)(CONCAT17(uStack_14c9,CONCAT16(uStack_14ca,uVar7)) >> 0x30);
          sStack_5f6 = sStack_5f6 + sStack_5d6 + sStack_5e6;
          sStack_5f4 = sStack_5f4 + sStack_5d4 + sStack_5e4;
          sStack_5f2 = sStack_5f2 + sStack_5d2 + sStack_5e2;
          sStack_5ee = sStack_5ee + sStack_5ce + sStack_5de;
          sStack_5ec = sStack_5ec + sStack_5cc + sStack_5dc;
          sStack_5ea = sStack_5ea + sStack_5ca + sStack_5da;
          uStack_14d6 = (undefined1)sStack_5f6;
          uStack_14d5 = (undefined1)((ushort)sStack_5f6 >> 8);
          uStack_14d4 = (undefined1)sStack_5f4;
          uStack_14d3 = (undefined1)((ushort)sStack_5f4 >> 8);
          uStack_14d2 = (undefined1)sStack_5f2;
          uStack_14d1 = (undefined1)((ushort)sStack_5f2 >> 8);
          uStack_14ce = (undefined1)sStack_5ee;
          uStack_14cd = (undefined1)((ushort)sStack_5ee >> 8);
          uStack_14cc = (undefined1)sStack_5ec;
          uStack_14cb = (undefined1)((ushort)sStack_5ec >> 8);
          uStack_14ca = (undefined1)sStack_5ea;
          uStack_14c9 = (undefined1)((ushort)sStack_5ea >> 8);
          auVar54[2] = uStack_14d6;
          auVar54._0_2_ = local_5b8 + local_5c8 + local_5d8 + local_5e8;
          auVar54[3] = uStack_14d5;
          auVar54[4] = uStack_14d4;
          auVar54[5] = uStack_14d3;
          auVar54[6] = uStack_14d2;
          auVar54[7] = uStack_14d1;
          auVar54[10] = uStack_14ce;
          auVar54._8_2_ = sStack_5b0 + sStack_5c0 + sStack_5d0 + sStack_5e0;
          auVar54[0xb] = uStack_14cd;
          auVar54[0xc] = uStack_14cc;
          auVar54[0xd] = uStack_14cb;
          auVar54[0xe] = uStack_14ca;
          auVar54[0xf] = uStack_14c9;
          auVar53._8_8_ = 0x20002000200020;
          auVar53._0_8_ = 0x20002000200020;
          auVar63 = paddsw(auVar54,auVar53);
          auVar63 = psraw(auVar63,ZEXT416(6));
          local_2b8 = auVar63._0_2_;
          sStack_2b6 = auVar63._2_2_;
          sStack_2b4 = auVar63._4_2_;
          sStack_2b2 = auVar63._6_2_;
          sStack_2b0 = auVar63._8_2_;
          sStack_2ae = auVar63._10_2_;
          sStack_2ac = auVar63._12_2_;
          sStack_2aa = auVar63._14_2_;
          *(ulong *)(local_1368 + local_160c) =
               CONCAT17((0 < sStack_2aa) * (sStack_2aa < 0x100) * auVar63[0xe] - (0xff < sStack_2aa)
                        ,CONCAT16((0 < sStack_2ac) * (sStack_2ac < 0x100) * auVar63[0xc] -
                                  (0xff < sStack_2ac),
                                  CONCAT15((0 < sStack_2ae) * (sStack_2ae < 0x100) * auVar63[10] -
                                           (0xff < sStack_2ae),
                                           CONCAT14((0 < sStack_2b0) * (sStack_2b0 < 0x100) *
                                                    auVar63[8] - (0xff < sStack_2b0),
                                                    CONCAT13((0 < sStack_2b2) * (sStack_2b2 < 0x100)
                                                             * auVar63[6] - (0xff < sStack_2b2),
                                                             CONCAT12((0 < sStack_2b4) *
                                                                      (sStack_2b4 < 0x100) *
                                                                      auVar63[4] -
                                                                      (0xff < sStack_2b4),
                                                                      CONCAT11((0 < sStack_2b6) *
                                                                               (sStack_2b6 < 0x100)
                                                                               * auVar63[2] -
                                                                               (0xff < sStack_2b6),
                                                                               (0 < local_2b8) *
                                                                               (local_2b8 < 0x100) *
                                                                               auVar63[0] -
                                                                               (0xff < local_2b8))))
                                                   ))));
          local_d38 = (undefined1)uVar3;
          uStack_d37 = (undefined1)((ulong)uVar3 >> 8);
          uStack_d36 = (undefined1)((ulong)uVar3 >> 0x10);
          uStack_d35 = (undefined1)((ulong)uVar3 >> 0x18);
          uStack_d34 = (undefined1)((ulong)uVar3 >> 0x20);
          uStack_d33 = (undefined1)((ulong)uVar3 >> 0x28);
          uStack_d32 = (undefined1)((ulong)uVar3 >> 0x30);
          uStack_d31 = (undefined1)((ulong)uVar3 >> 0x38);
          local_d48 = auVar64[1];
          uStack_d47 = auVar64[2];
          uStack_d46 = auVar64[3];
          uStack_d45 = auVar64[4];
          uStack_d44 = auVar64[5];
          uStack_d43 = auVar64[6];
          uStack_d42 = auVar64[7];
          uStack_d41 = auVar64[8];
          auVar34[1] = local_d48;
          auVar34[0] = local_d38;
          auVar34[2] = uStack_d37;
          auVar34[3] = uStack_d47;
          auVar34[4] = uStack_d36;
          auVar34[5] = uStack_d46;
          auVar34[6] = uStack_d35;
          auVar34[7] = uStack_d45;
          auVar34[9] = uStack_d44;
          auVar34[8] = uStack_d34;
          auVar34[10] = uStack_d33;
          auVar34[0xb] = uStack_d43;
          auVar34[0xc] = uStack_d32;
          auVar34[0xd] = uStack_d42;
          auVar34[0xe] = uStack_d31;
          auVar34[0xf] = uStack_d41;
          auVar63 = pmaddubsw(auVar34,auVar56);
          uStack_d51 = auVar64[9];
          uStack_d61 = auVar64[10];
          auVar33[2] = uStack_d46;
          auVar33._0_2_ = auVar64._2_2_;
          auVar33[3] = uStack_d45;
          auVar33[4] = uStack_d45;
          auVar33[5] = uStack_d44;
          auVar33[6] = uStack_d44;
          auVar33[7] = uStack_d43;
          auVar33[10] = uStack_d42;
          auVar33._8_2_ = auVar64._6_2_;
          auVar33[0xb] = uStack_d41;
          auVar33[0xc] = uStack_d41;
          auVar33[0xd] = uStack_d51;
          auVar33[0xe] = uStack_d51;
          auVar33[0xf] = uStack_d61;
          auVar60 = pmaddubsw(auVar33,auVar57);
          uStack_d71 = auVar64[0xb];
          uStack_d81 = auVar64[0xc];
          auVar32[2] = uStack_d44;
          auVar32._0_2_ = auVar64._4_2_;
          auVar32[3] = uStack_d43;
          auVar32[4] = uStack_d43;
          auVar32[5] = uStack_d42;
          auVar32[6] = uStack_d42;
          auVar32[7] = uStack_d41;
          auVar32[10] = uStack_d51;
          auVar32._8_2_ = auVar64._8_2_;
          auVar32[0xb] = uStack_d61;
          auVar32[0xc] = uStack_d61;
          auVar32[0xd] = uStack_d71;
          auVar32[0xe] = uStack_d71;
          auVar32[0xf] = uStack_d81;
          auVar61 = pmaddubsw(auVar32,auVar58);
          uStack_d91 = auVar64[0xd];
          uStack_da1 = auVar64[0xe];
          auVar31[2] = uStack_d42;
          auVar31._0_2_ = auVar64._6_2_;
          auVar31[3] = uStack_d41;
          auVar31[4] = uStack_d41;
          auVar31[5] = uStack_d51;
          auVar31[6] = uStack_d51;
          auVar31[7] = uStack_d61;
          auVar31[10] = uStack_d71;
          auVar31._8_2_ = auVar64._10_2_;
          auVar31[0xb] = uStack_d81;
          auVar31[0xc] = uStack_d81;
          auVar31[0xd] = uStack_d91;
          auVar31[0xe] = uStack_d91;
          auVar31[0xf] = uStack_da1;
          auVar64 = pmaddubsw(auVar31,auVar59);
          local_618 = auVar63._0_2_;
          sStack_616 = auVar63._2_2_;
          sStack_614 = auVar63._4_2_;
          sStack_612 = auVar63._6_2_;
          sStack_610 = auVar63._8_2_;
          sStack_60e = auVar63._10_2_;
          sStack_60c = auVar63._12_2_;
          sStack_60a = auVar63._14_2_;
          local_628 = auVar60._0_2_;
          sStack_626 = auVar60._2_2_;
          sStack_624 = auVar60._4_2_;
          sStack_622 = auVar60._6_2_;
          sStack_620 = auVar60._8_2_;
          sStack_61e = auVar60._10_2_;
          sStack_61c = auVar60._12_2_;
          sStack_61a = auVar60._14_2_;
          local_638 = auVar61._0_2_;
          sStack_636 = auVar61._2_2_;
          sStack_634 = auVar61._4_2_;
          sStack_632 = auVar61._6_2_;
          sStack_630 = auVar61._8_2_;
          sStack_62e = auVar61._10_2_;
          sStack_62c = auVar61._12_2_;
          sStack_62a = auVar61._14_2_;
          local_648 = auVar64._0_2_;
          sStack_646 = auVar64._2_2_;
          sStack_644 = auVar64._4_2_;
          sStack_642 = auVar64._6_2_;
          sStack_640 = auVar64._8_2_;
          sStack_63e = auVar64._10_2_;
          sStack_63c = auVar64._12_2_;
          sStack_63a = auVar64._14_2_;
          local_1558._0_4_ =
               CONCAT22(sStack_616 + sStack_626 + sStack_636 + sStack_646,
                        local_618 + local_628 + local_638 + local_648);
          local_1558._0_6_ =
               CONCAT24(sStack_614 + sStack_624 + sStack_634 + sStack_644,(uint)local_1558);
          local_1558 = CONCAT26(sStack_612 + sStack_622 + sStack_632 + sStack_642,
                                (undefined6)local_1558);
          uStack_1550._0_2_ = sStack_610 + sStack_620 + sStack_630 + sStack_640;
          uStack_1550._2_2_ = sStack_60e + sStack_61e + sStack_62e + sStack_63e;
          uStack_1550._4_2_ = sStack_60c + sStack_61c + sStack_62c + sStack_63c;
          uStack_1550._6_2_ = sStack_60a + sStack_61a + sStack_62a + sStack_63a;
          auVar52._8_8_ = uStack_1550;
          auVar52._0_8_ = local_1558;
          auVar51._8_8_ = 0x20002000200020;
          auVar51._0_8_ = 0x20002000200020;
          auVar63 = paddsw(auVar52,auVar51);
          auVar63 = psraw(auVar63,ZEXT416(6));
          local_2d8 = auVar63._0_2_;
          sStack_2d6 = auVar63._2_2_;
          sStack_2d4 = auVar63._4_2_;
          sStack_2d2 = auVar63._6_2_;
          sStack_2d0 = auVar63._8_2_;
          sStack_2ce = auVar63._10_2_;
          sStack_2cc = auVar63._12_2_;
          sStack_2ca = auVar63._14_2_;
          local_1558._0_2_ =
               CONCAT11((0 < sStack_2d6) * (sStack_2d6 < 0x100) * auVar63[2] - (0xff < sStack_2d6),
                        (0 < local_2d8) * (local_2d8 < 0x100) * auVar63[0] - (0xff < local_2d8));
          local_1558._0_3_ =
               CONCAT12((0 < sStack_2d4) * (sStack_2d4 < 0x100) * auVar63[4] - (0xff < sStack_2d4),
                        (undefined2)local_1558);
          local_1558._0_4_ =
               CONCAT13((0 < sStack_2d2) * (sStack_2d2 < 0x100) * auVar63[6] - (0xff < sStack_2d2),
                        (undefined3)local_1558);
          local_1558._0_6_ =
               CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) * auVar63[10] - (0xff < sStack_2ce),
                        CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) * auVar63[8] -
                                 (0xff < sStack_2d0),(uint)local_1558));
          local_1558 = CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) * auVar63[0xe] -
                                (0xff < sStack_2ca),
                                CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) * auVar63[0xc] -
                                         (0xff < sStack_2cc),(undefined6)local_1558));
          *(undefined8 *)(local_1368 + in_ECX + (long)local_160c) = local_1558;
          local_160c = local_160c + 8;
        }
        local_1360 = local_1360 + (in_EDX << 1);
        local_1368 = local_1368 + (in_ECX << 1);
      }
    }
    else {
      for (local_1380 = 0; local_1380 < (int)in_R9D; local_1380 = local_1380 + 2) {
        local_1610 = 0;
        for (local_1384 = 0; local_1384 < (int)in_stack_00000008; local_1384 = local_1384 + 4) {
          pauVar1 = (undefined1 (*) [16])(local_1360 + -3 + (long)local_1610);
          uVar2 = *(undefined8 *)*pauVar1;
          auVar63 = *pauVar1;
          pauVar1 = (undefined1 (*) [16])((long)local_1610 + -3 + local_1360 + in_EDX);
          uVar3 = *(undefined8 *)*pauVar1;
          auVar64 = *pauVar1;
          local_db8 = (undefined1)uVar2;
          uStack_db7 = (undefined1)((ulong)uVar2 >> 8);
          uStack_db6 = (undefined1)((ulong)uVar2 >> 0x10);
          uStack_db5 = (undefined1)((ulong)uVar2 >> 0x18);
          uStack_db4 = (undefined1)((ulong)uVar2 >> 0x20);
          uStack_db3 = (undefined1)((ulong)uVar2 >> 0x28);
          uStack_db2 = (undefined1)((ulong)uVar2 >> 0x30);
          uStack_db1 = (undefined1)((ulong)uVar2 >> 0x38);
          local_dc8 = auVar63[1];
          uStack_dc7 = auVar63[2];
          uStack_dc6 = auVar63[3];
          uStack_dc5 = auVar63[4];
          uStack_dc4 = auVar63[5];
          uStack_dc3 = auVar63[6];
          uStack_dc2 = auVar63[7];
          uStack_dc1 = auVar63[8];
          auVar30[1] = local_dc8;
          auVar30[0] = local_db8;
          auVar30[2] = uStack_db7;
          auVar30[3] = uStack_dc7;
          auVar30[4] = uStack_db6;
          auVar30[5] = uStack_dc6;
          auVar30[6] = uStack_db5;
          auVar30[7] = uStack_dc5;
          auVar30[9] = uStack_dc4;
          auVar30[8] = uStack_db4;
          auVar30[10] = uStack_db3;
          auVar30[0xb] = uStack_dc3;
          auVar30[0xc] = uStack_db2;
          auVar30[0xd] = uStack_dc2;
          auVar30[0xe] = uStack_db1;
          auVar30[0xf] = uStack_dc1;
          auVar60 = pmaddubsw(auVar30,auVar56);
          uStack_dd1 = auVar63[9];
          uStack_de1 = auVar63[10];
          auVar29[2] = uStack_dc6;
          auVar29._0_2_ = auVar63._2_2_;
          auVar29[3] = uStack_dc5;
          auVar29[4] = uStack_dc5;
          auVar29[5] = uStack_dc4;
          auVar29[6] = uStack_dc4;
          auVar29[7] = uStack_dc3;
          auVar29[10] = uStack_dc2;
          auVar29._8_2_ = auVar63._6_2_;
          auVar29[0xb] = uStack_dc1;
          auVar29[0xc] = uStack_dc1;
          auVar29[0xd] = uStack_dd1;
          auVar29[0xe] = uStack_dd1;
          auVar29[0xf] = uStack_de1;
          auVar61 = pmaddubsw(auVar29,auVar57);
          uStack_df1 = auVar63[0xb];
          uStack_e01 = auVar63[0xc];
          auVar28[2] = uStack_dc4;
          auVar28._0_2_ = auVar63._4_2_;
          auVar28[3] = uStack_dc3;
          auVar28[4] = uStack_dc3;
          auVar28[5] = uStack_dc2;
          auVar28[6] = uStack_dc2;
          auVar28[7] = uStack_dc1;
          auVar28[10] = uStack_dd1;
          auVar28._8_2_ = auVar63._8_2_;
          auVar28[0xb] = uStack_de1;
          auVar28[0xc] = uStack_de1;
          auVar28[0xd] = uStack_df1;
          auVar28[0xe] = uStack_df1;
          auVar28[0xf] = uStack_e01;
          auVar62 = pmaddubsw(auVar28,auVar58);
          uStack_e11 = auVar63[0xd];
          uStack_e21 = auVar63[0xe];
          auVar27[2] = uStack_dc2;
          auVar27._0_2_ = auVar63._6_2_;
          auVar27[3] = uStack_dc1;
          auVar27[4] = uStack_dc1;
          auVar27[5] = uStack_dd1;
          auVar27[6] = uStack_dd1;
          auVar27[7] = uStack_de1;
          auVar27[10] = uStack_df1;
          auVar27._8_2_ = auVar63._10_2_;
          auVar27[0xb] = uStack_e01;
          auVar27[0xc] = uStack_e01;
          auVar27[0xd] = uStack_e11;
          auVar27[0xe] = uStack_e11;
          auVar27[0xf] = uStack_e21;
          auVar63 = pmaddubsw(auVar27,auVar59);
          local_678 = auVar60._0_2_;
          sStack_676 = auVar60._2_2_;
          sStack_674 = auVar60._4_2_;
          sStack_672 = auVar60._6_2_;
          sStack_670 = auVar60._8_2_;
          sStack_66e = auVar60._10_2_;
          sStack_66c = auVar60._12_2_;
          sStack_66a = auVar60._14_2_;
          local_688 = auVar61._0_2_;
          sStack_686 = auVar61._2_2_;
          sStack_684 = auVar61._4_2_;
          sStack_682 = auVar61._6_2_;
          sStack_680 = auVar61._8_2_;
          sStack_67e = auVar61._10_2_;
          sStack_67c = auVar61._12_2_;
          sStack_67a = auVar61._14_2_;
          uStack_14d6 = (undefined1)(sStack_676 + sStack_686);
          uStack_14d5 = (undefined1)((ushort)(sStack_676 + sStack_686) >> 8);
          uStack_14d4 = (undefined1)(sStack_674 + sStack_684);
          uStack_14d3 = (undefined1)((ushort)(sStack_674 + sStack_684) >> 8);
          uStack_14d2 = (undefined1)(sStack_672 + sStack_682);
          uStack_14d1 = (undefined1)((ushort)(sStack_672 + sStack_682) >> 8);
          uStack_14ce = (undefined1)(sStack_66e + sStack_67e);
          uStack_14cd = (undefined1)((ushort)(sStack_66e + sStack_67e) >> 8);
          uStack_14cc = (undefined1)(sStack_66c + sStack_67c);
          uStack_14cb = (undefined1)((ushort)(sStack_66c + sStack_67c) >> 8);
          uStack_14ca = (undefined1)(sStack_66a + sStack_67a);
          uStack_14c9 = (undefined1)((ushort)(sStack_66a + sStack_67a) >> 8);
          local_698 = auVar62._0_2_;
          sStack_696 = auVar62._2_2_;
          sStack_694 = auVar62._4_2_;
          sStack_692 = auVar62._6_2_;
          sStack_690 = auVar62._8_2_;
          sStack_68e = auVar62._10_2_;
          sStack_68c = auVar62._12_2_;
          sStack_68a = auVar62._14_2_;
          local_6a8 = auVar63._0_2_;
          sStack_6a6 = auVar63._2_2_;
          sStack_6a4 = auVar63._4_2_;
          sStack_6a2 = auVar63._6_2_;
          sStack_6a0 = auVar63._8_2_;
          sStack_69e = auVar63._10_2_;
          sStack_69c = auVar63._12_2_;
          sStack_69a = auVar63._14_2_;
          uVar4 = CONCAT13(uStack_14d5,CONCAT12(uStack_14d6,local_678 + local_688));
          uVar5 = CONCAT15(uStack_14d3,CONCAT14(uStack_14d4,uVar4));
          uVar6 = CONCAT13(uStack_14cd,CONCAT12(uStack_14ce,sStack_670 + sStack_680));
          uVar7 = CONCAT15(uStack_14cb,CONCAT14(uStack_14cc,uVar6));
          sStack_6b6 = (short)((uint)uVar4 >> 0x10);
          sStack_6b4 = (short)((uint6)uVar5 >> 0x20);
          sStack_6b2 = (short)(CONCAT17(uStack_14d1,CONCAT16(uStack_14d2,uVar5)) >> 0x30);
          sStack_6ae = (short)((uint)uVar6 >> 0x10);
          sStack_6ac = (short)((uint6)uVar7 >> 0x20);
          sStack_6aa = (short)(CONCAT17(uStack_14c9,CONCAT16(uStack_14ca,uVar7)) >> 0x30);
          sStack_6b6 = sStack_6b6 + sStack_696 + sStack_6a6;
          sStack_6b4 = sStack_6b4 + sStack_694 + sStack_6a4;
          sStack_6b2 = sStack_6b2 + sStack_692 + sStack_6a2;
          sStack_6ae = sStack_6ae + sStack_68e + sStack_69e;
          sStack_6ac = sStack_6ac + sStack_68c + sStack_69c;
          sStack_6aa = sStack_6aa + sStack_68a + sStack_69a;
          uStack_14d6 = (undefined1)sStack_6b6;
          uStack_14d5 = (undefined1)((ushort)sStack_6b6 >> 8);
          uStack_14d4 = (undefined1)sStack_6b4;
          uStack_14d3 = (undefined1)((ushort)sStack_6b4 >> 8);
          uStack_14d2 = (undefined1)sStack_6b2;
          uStack_14d1 = (undefined1)((ushort)sStack_6b2 >> 8);
          uStack_14ce = (undefined1)sStack_6ae;
          uStack_14cd = (undefined1)((ushort)sStack_6ae >> 8);
          uStack_14cc = (undefined1)sStack_6ac;
          uStack_14cb = (undefined1)((ushort)sStack_6ac >> 8);
          uStack_14ca = (undefined1)sStack_6aa;
          uStack_14c9 = (undefined1)((ushort)sStack_6aa >> 8);
          auVar50[2] = uStack_14d6;
          auVar50._0_2_ = local_678 + local_688 + local_698 + local_6a8;
          auVar50[3] = uStack_14d5;
          auVar50[4] = uStack_14d4;
          auVar50[5] = uStack_14d3;
          auVar50[6] = uStack_14d2;
          auVar50[7] = uStack_14d1;
          auVar50[10] = uStack_14ce;
          auVar50._8_2_ = sStack_670 + sStack_680 + sStack_690 + sStack_6a0;
          auVar50[0xb] = uStack_14cd;
          auVar50[0xc] = uStack_14cc;
          auVar50[0xd] = uStack_14cb;
          auVar50[0xe] = uStack_14ca;
          auVar50[0xf] = uStack_14c9;
          auVar49._8_8_ = 0x20002000200020;
          auVar49._0_8_ = 0x20002000200020;
          auVar63 = paddsw(auVar50,auVar49);
          auVar63 = psraw(auVar63,ZEXT416(6));
          local_2f8 = auVar63._0_2_;
          sStack_2f6 = auVar63._2_2_;
          sStack_2f4 = auVar63._4_2_;
          sStack_2f2 = auVar63._6_2_;
          uVar55 = *(ulong *)(local_1368 + local_1610) & 0xffffffff00000000;
          uStack_14d4 = (undefined1)(uVar55 >> 0x20);
          uStack_14d3 = (undefined1)(uVar55 >> 0x28);
          uStack_14d2 = (undefined1)(uVar55 >> 0x30);
          uStack_14d1 = (undefined1)(uVar55 >> 0x38);
          *(ulong *)(local_1368 + local_1610) =
               CONCAT17(uStack_14d1,
                        CONCAT16(uStack_14d2,
                                 CONCAT15(uStack_14d3,
                                          CONCAT14(uStack_14d4,
                                                   CONCAT13((0 < sStack_2f2) * (sStack_2f2 < 0x100)
                                                            * auVar63[6] - (0xff < sStack_2f2),
                                                            CONCAT12((0 < sStack_2f4) *
                                                                     (sStack_2f4 < 0x100) *
                                                                     auVar63[4] -
                                                                     (0xff < sStack_2f4),
                                                                     CONCAT11((0 < sStack_2f6) *
                                                                              (sStack_2f6 < 0x100) *
                                                                              auVar63[2] -
                                                                              (0xff < sStack_2f6),
                                                                              (0 < local_2f8) *
                                                                              (local_2f8 < 0x100) *
                                                                              auVar63[0] -
                                                                              (0xff < local_2f8)))))
                                         )));
          local_e38 = (undefined1)uVar3;
          uStack_e37 = (undefined1)((ulong)uVar3 >> 8);
          uStack_e36 = (undefined1)((ulong)uVar3 >> 0x10);
          uStack_e35 = (undefined1)((ulong)uVar3 >> 0x18);
          uStack_e34 = (undefined1)((ulong)uVar3 >> 0x20);
          uStack_e33 = (undefined1)((ulong)uVar3 >> 0x28);
          uStack_e32 = (undefined1)((ulong)uVar3 >> 0x30);
          uStack_e31 = (undefined1)((ulong)uVar3 >> 0x38);
          local_e48 = auVar64[1];
          uStack_e47 = auVar64[2];
          uStack_e46 = auVar64[3];
          uStack_e45 = auVar64[4];
          uStack_e44 = auVar64[5];
          uStack_e43 = auVar64[6];
          uStack_e42 = auVar64[7];
          uStack_e41 = auVar64[8];
          auVar26[1] = local_e48;
          auVar26[0] = local_e38;
          auVar26[2] = uStack_e37;
          auVar26[3] = uStack_e47;
          auVar26[4] = uStack_e36;
          auVar26[5] = uStack_e46;
          auVar26[6] = uStack_e35;
          auVar26[7] = uStack_e45;
          auVar26[9] = uStack_e44;
          auVar26[8] = uStack_e34;
          auVar26[10] = uStack_e33;
          auVar26[0xb] = uStack_e43;
          auVar26[0xc] = uStack_e32;
          auVar26[0xd] = uStack_e42;
          auVar26[0xe] = uStack_e31;
          auVar26[0xf] = uStack_e41;
          auVar63 = pmaddubsw(auVar26,auVar56);
          uStack_e51 = auVar64[9];
          uStack_e61 = auVar64[10];
          auVar25[2] = uStack_e46;
          auVar25._0_2_ = auVar64._2_2_;
          auVar25[3] = uStack_e45;
          auVar25[4] = uStack_e45;
          auVar25[5] = uStack_e44;
          auVar25[6] = uStack_e44;
          auVar25[7] = uStack_e43;
          auVar25[10] = uStack_e42;
          auVar25._8_2_ = auVar64._6_2_;
          auVar25[0xb] = uStack_e41;
          auVar25[0xc] = uStack_e41;
          auVar25[0xd] = uStack_e51;
          auVar25[0xe] = uStack_e51;
          auVar25[0xf] = uStack_e61;
          auVar60 = pmaddubsw(auVar25,auVar57);
          uStack_e71 = auVar64[0xb];
          uStack_e81 = auVar64[0xc];
          auVar24[2] = uStack_e44;
          auVar24._0_2_ = auVar64._4_2_;
          auVar24[3] = uStack_e43;
          auVar24[4] = uStack_e43;
          auVar24[5] = uStack_e42;
          auVar24[6] = uStack_e42;
          auVar24[7] = uStack_e41;
          auVar24[10] = uStack_e51;
          auVar24._8_2_ = auVar64._8_2_;
          auVar24[0xb] = uStack_e61;
          auVar24[0xc] = uStack_e61;
          auVar24[0xd] = uStack_e71;
          auVar24[0xe] = uStack_e71;
          auVar24[0xf] = uStack_e81;
          auVar61 = pmaddubsw(auVar24,auVar58);
          uStack_e91 = auVar64[0xd];
          uStack_ea1 = auVar64[0xe];
          auVar23[2] = uStack_e42;
          auVar23._0_2_ = auVar64._6_2_;
          auVar23[3] = uStack_e41;
          auVar23[4] = uStack_e41;
          auVar23[5] = uStack_e51;
          auVar23[6] = uStack_e51;
          auVar23[7] = uStack_e61;
          auVar23[10] = uStack_e71;
          auVar23._8_2_ = auVar64._10_2_;
          auVar23[0xb] = uStack_e81;
          auVar23[0xc] = uStack_e81;
          auVar23[0xd] = uStack_e91;
          auVar23[0xe] = uStack_e91;
          auVar23[0xf] = uStack_ea1;
          auVar64 = pmaddubsw(auVar23,auVar59);
          local_6d8 = auVar63._0_2_;
          sStack_6d6 = auVar63._2_2_;
          sStack_6d4 = auVar63._4_2_;
          sStack_6d2 = auVar63._6_2_;
          sStack_6d0 = auVar63._8_2_;
          sStack_6ce = auVar63._10_2_;
          sStack_6cc = auVar63._12_2_;
          sStack_6ca = auVar63._14_2_;
          local_6e8 = auVar60._0_2_;
          sStack_6e6 = auVar60._2_2_;
          sStack_6e4 = auVar60._4_2_;
          sStack_6e2 = auVar60._6_2_;
          sStack_6e0 = auVar60._8_2_;
          sStack_6de = auVar60._10_2_;
          sStack_6dc = auVar60._12_2_;
          sStack_6da = auVar60._14_2_;
          local_6f8 = auVar61._0_2_;
          sStack_6f6 = auVar61._2_2_;
          sStack_6f4 = auVar61._4_2_;
          sStack_6f2 = auVar61._6_2_;
          sStack_6f0 = auVar61._8_2_;
          sStack_6ee = auVar61._10_2_;
          sStack_6ec = auVar61._12_2_;
          sStack_6ea = auVar61._14_2_;
          local_708 = auVar64._0_2_;
          sStack_706 = auVar64._2_2_;
          sStack_704 = auVar64._4_2_;
          sStack_702 = auVar64._6_2_;
          sStack_700 = auVar64._8_2_;
          sStack_6fe = auVar64._10_2_;
          sStack_6fc = auVar64._12_2_;
          sStack_6fa = auVar64._14_2_;
          local_1558._0_4_ =
               CONCAT22(sStack_6d6 + sStack_6e6 + sStack_6f6 + sStack_706,
                        local_6d8 + local_6e8 + local_6f8 + local_708);
          local_1558._0_6_ =
               CONCAT24(sStack_6d4 + sStack_6e4 + sStack_6f4 + sStack_704,(uint)local_1558);
          local_1558 = CONCAT26(sStack_6d2 + sStack_6e2 + sStack_6f2 + sStack_702,
                                (undefined6)local_1558);
          uStack_1550._0_2_ = sStack_6d0 + sStack_6e0 + sStack_6f0 + sStack_700;
          uStack_1550._2_2_ = sStack_6ce + sStack_6de + sStack_6ee + sStack_6fe;
          uStack_1550._4_2_ = sStack_6cc + sStack_6dc + sStack_6ec + sStack_6fc;
          uStack_1550._6_2_ = sStack_6ca + sStack_6da + sStack_6ea + sStack_6fa;
          auVar48._8_8_ = uStack_1550;
          auVar48._0_8_ = local_1558;
          auVar47._8_8_ = 0x20002000200020;
          auVar47._0_8_ = 0x20002000200020;
          auVar63 = paddsw(auVar48,auVar47);
          auVar63 = psraw(auVar63,ZEXT416(6));
          local_318 = auVar63._0_2_;
          sStack_316 = auVar63._2_2_;
          sStack_314 = auVar63._4_2_;
          sStack_312 = auVar63._6_2_;
          local_1558._0_2_ =
               CONCAT11((0 < sStack_316) * (sStack_316 < 0x100) * auVar63[2] - (0xff < sStack_316),
                        (0 < local_318) * (local_318 < 0x100) * auVar63[0] - (0xff < local_318));
          local_1558._0_3_ =
               CONCAT12((0 < sStack_314) * (sStack_314 < 0x100) * auVar63[4] - (0xff < sStack_314),
                        (undefined2)local_1558);
          local_1558._0_4_ =
               CONCAT13((0 < sStack_312) * (sStack_312 < 0x100) * auVar63[6] - (0xff < sStack_312),
                        (undefined3)local_1558);
          *(ulong *)(local_1368 + in_ECX + (long)local_1610) =
               (ulong)(uint)local_1558 |
               *(ulong *)(local_1368 + in_ECX + (long)local_1610) & 0xffffffff00000000;
          local_1610 = local_1610 + 4;
        }
        local_1360 = local_1360 + (in_EDX << 1);
        local_1368 = local_1368 + (in_ECX << 1);
      }
    }
  }
  else if ((in_stack_00000008 & 7) == 0) {
    for (local_1380 = 0; local_1380 < (int)in_R9D; local_1380 = local_1380 + 1) {
      local_1614 = 0;
      for (local_1384 = 0; local_1384 < (int)in_stack_00000008; local_1384 = local_1384 + 8) {
        pauVar1 = (undefined1 (*) [16])(local_1360 + -3 + (long)local_1614);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar63 = *pauVar1;
        local_eb8 = (undefined1)uVar2;
        uStack_eb7 = (undefined1)((ulong)uVar2 >> 8);
        uStack_eb6 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_eb5 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_eb4 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_eb3 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_eb2 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_eb1 = (undefined1)((ulong)uVar2 >> 0x38);
        local_ec8 = auVar63[1];
        uStack_ec7 = auVar63[2];
        uStack_ec6 = auVar63[3];
        uStack_ec5 = auVar63[4];
        uStack_ec4 = auVar63[5];
        uStack_ec3 = auVar63[6];
        uStack_ec2 = auVar63[7];
        uStack_ec1 = auVar63[8];
        auVar22[1] = local_ec8;
        auVar22[0] = local_eb8;
        auVar22[2] = uStack_eb7;
        auVar22[3] = uStack_ec7;
        auVar22[4] = uStack_eb6;
        auVar22[5] = uStack_ec6;
        auVar22[6] = uStack_eb5;
        auVar22[7] = uStack_ec5;
        auVar22[9] = uStack_ec4;
        auVar22[8] = uStack_eb4;
        auVar22[10] = uStack_eb3;
        auVar22[0xb] = uStack_ec3;
        auVar22[0xc] = uStack_eb2;
        auVar22[0xd] = uStack_ec2;
        auVar22[0xe] = uStack_eb1;
        auVar22[0xf] = uStack_ec1;
        auVar64 = pmaddubsw(auVar22,auVar56);
        uStack_ed1 = auVar63[9];
        uStack_ee1 = auVar63[10];
        auVar21[2] = uStack_ec6;
        auVar21._0_2_ = auVar63._2_2_;
        auVar21[3] = uStack_ec5;
        auVar21[4] = uStack_ec5;
        auVar21[5] = uStack_ec4;
        auVar21[6] = uStack_ec4;
        auVar21[7] = uStack_ec3;
        auVar21[10] = uStack_ec2;
        auVar21._8_2_ = auVar63._6_2_;
        auVar21[0xb] = uStack_ec1;
        auVar21[0xc] = uStack_ec1;
        auVar21[0xd] = uStack_ed1;
        auVar21[0xe] = uStack_ed1;
        auVar21[0xf] = uStack_ee1;
        auVar60 = pmaddubsw(auVar21,auVar57);
        uStack_ef1 = auVar63[0xb];
        uStack_f01 = auVar63[0xc];
        auVar20[2] = uStack_ec4;
        auVar20._0_2_ = auVar63._4_2_;
        auVar20[3] = uStack_ec3;
        auVar20[4] = uStack_ec3;
        auVar20[5] = uStack_ec2;
        auVar20[6] = uStack_ec2;
        auVar20[7] = uStack_ec1;
        auVar20[10] = uStack_ed1;
        auVar20._8_2_ = auVar63._8_2_;
        auVar20[0xb] = uStack_ee1;
        auVar20[0xc] = uStack_ee1;
        auVar20[0xd] = uStack_ef1;
        auVar20[0xe] = uStack_ef1;
        auVar20[0xf] = uStack_f01;
        auVar61 = pmaddubsw(auVar20,auVar58);
        uStack_f11 = auVar63[0xd];
        uStack_f21 = auVar63[0xe];
        auVar19[2] = uStack_ec2;
        auVar19._0_2_ = auVar63._6_2_;
        auVar19[3] = uStack_ec1;
        auVar19[4] = uStack_ec1;
        auVar19[5] = uStack_ed1;
        auVar19[6] = uStack_ed1;
        auVar19[7] = uStack_ee1;
        auVar19[10] = uStack_ef1;
        auVar19._8_2_ = auVar63._10_2_;
        auVar19[0xb] = uStack_f01;
        auVar19[0xc] = uStack_f01;
        auVar19[0xd] = uStack_f11;
        auVar19[0xe] = uStack_f11;
        auVar19[0xf] = uStack_f21;
        auVar63 = pmaddubsw(auVar19,auVar59);
        local_738 = auVar64._0_2_;
        sStack_736 = auVar64._2_2_;
        sStack_734 = auVar64._4_2_;
        sStack_732 = auVar64._6_2_;
        sStack_730 = auVar64._8_2_;
        sStack_72e = auVar64._10_2_;
        sStack_72c = auVar64._12_2_;
        sStack_72a = auVar64._14_2_;
        local_748 = auVar60._0_2_;
        sStack_746 = auVar60._2_2_;
        sStack_744 = auVar60._4_2_;
        sStack_742 = auVar60._6_2_;
        sStack_740 = auVar60._8_2_;
        sStack_73e = auVar60._10_2_;
        sStack_73c = auVar60._12_2_;
        sStack_73a = auVar60._14_2_;
        uStack_14d6 = (undefined1)(sStack_736 + sStack_746);
        uStack_14d5 = (undefined1)((ushort)(sStack_736 + sStack_746) >> 8);
        uStack_14d4 = (undefined1)(sStack_734 + sStack_744);
        uStack_14d3 = (undefined1)((ushort)(sStack_734 + sStack_744) >> 8);
        uStack_14d2 = (undefined1)(sStack_732 + sStack_742);
        uStack_14d1 = (undefined1)((ushort)(sStack_732 + sStack_742) >> 8);
        uStack_14ce = (undefined1)(sStack_72e + sStack_73e);
        uStack_14cd = (undefined1)((ushort)(sStack_72e + sStack_73e) >> 8);
        uStack_14cc = (undefined1)(sStack_72c + sStack_73c);
        uStack_14cb = (undefined1)((ushort)(sStack_72c + sStack_73c) >> 8);
        uStack_14ca = (undefined1)(sStack_72a + sStack_73a);
        uStack_14c9 = (undefined1)((ushort)(sStack_72a + sStack_73a) >> 8);
        local_758 = auVar61._0_2_;
        sStack_756 = auVar61._2_2_;
        sStack_754 = auVar61._4_2_;
        sStack_752 = auVar61._6_2_;
        sStack_750 = auVar61._8_2_;
        sStack_74e = auVar61._10_2_;
        sStack_74c = auVar61._12_2_;
        sStack_74a = auVar61._14_2_;
        local_768 = auVar63._0_2_;
        sStack_766 = auVar63._2_2_;
        sStack_764 = auVar63._4_2_;
        sStack_762 = auVar63._6_2_;
        sStack_760 = auVar63._8_2_;
        sStack_75e = auVar63._10_2_;
        sStack_75c = auVar63._12_2_;
        sStack_75a = auVar63._14_2_;
        uVar4 = CONCAT13(uStack_14d5,CONCAT12(uStack_14d6,local_738 + local_748));
        uVar5 = CONCAT15(uStack_14d3,CONCAT14(uStack_14d4,uVar4));
        uVar6 = CONCAT13(uStack_14cd,CONCAT12(uStack_14ce,sStack_730 + sStack_740));
        uVar7 = CONCAT15(uStack_14cb,CONCAT14(uStack_14cc,uVar6));
        sStack_776 = (short)((uint)uVar4 >> 0x10);
        sStack_774 = (short)((uint6)uVar5 >> 0x20);
        sStack_772 = (short)(CONCAT17(uStack_14d1,CONCAT16(uStack_14d2,uVar5)) >> 0x30);
        sStack_76e = (short)((uint)uVar6 >> 0x10);
        sStack_76c = (short)((uint6)uVar7 >> 0x20);
        sStack_76a = (short)(CONCAT17(uStack_14c9,CONCAT16(uStack_14ca,uVar7)) >> 0x30);
        sStack_776 = sStack_776 + sStack_756 + sStack_766;
        sStack_774 = sStack_774 + sStack_754 + sStack_764;
        sStack_772 = sStack_772 + sStack_752 + sStack_762;
        sStack_76e = sStack_76e + sStack_74e + sStack_75e;
        sStack_76c = sStack_76c + sStack_74c + sStack_75c;
        sStack_76a = sStack_76a + sStack_74a + sStack_75a;
        uStack_14d6 = (undefined1)sStack_776;
        uStack_14d5 = (undefined1)((ushort)sStack_776 >> 8);
        uStack_14d4 = (undefined1)sStack_774;
        uStack_14d3 = (undefined1)((ushort)sStack_774 >> 8);
        uStack_14d2 = (undefined1)sStack_772;
        uStack_14d1 = (undefined1)((ushort)sStack_772 >> 8);
        uStack_14ce = (undefined1)sStack_76e;
        uStack_14cd = (undefined1)((ushort)sStack_76e >> 8);
        uStack_14cc = (undefined1)sStack_76c;
        uStack_14cb = (undefined1)((ushort)sStack_76c >> 8);
        uStack_14ca = (undefined1)sStack_76a;
        uStack_14c9 = (undefined1)((ushort)sStack_76a >> 8);
        auVar46[2] = uStack_14d6;
        auVar46._0_2_ = local_738 + local_748 + local_758 + local_768;
        auVar46[3] = uStack_14d5;
        auVar46[4] = uStack_14d4;
        auVar46[5] = uStack_14d3;
        auVar46[6] = uStack_14d2;
        auVar46[7] = uStack_14d1;
        auVar46[10] = uStack_14ce;
        auVar46._8_2_ = sStack_730 + sStack_740 + sStack_750 + sStack_760;
        auVar46[0xb] = uStack_14cd;
        auVar46[0xc] = uStack_14cc;
        auVar46[0xd] = uStack_14cb;
        auVar46[0xe] = uStack_14ca;
        auVar46[0xf] = uStack_14c9;
        auVar45._8_8_ = 0x20002000200020;
        auVar45._0_8_ = 0x20002000200020;
        auVar63 = paddsw(auVar46,auVar45);
        auVar63 = psraw(auVar63,ZEXT416(6));
        local_338 = auVar63._0_2_;
        sStack_336 = auVar63._2_2_;
        sStack_334 = auVar63._4_2_;
        sStack_332 = auVar63._6_2_;
        sStack_330 = auVar63._8_2_;
        sStack_32e = auVar63._10_2_;
        sStack_32c = auVar63._12_2_;
        sStack_32a = auVar63._14_2_;
        *(ulong *)(local_1368 + local_1614) =
             CONCAT17((0 < sStack_32a) * (sStack_32a < 0x100) * auVar63[0xe] - (0xff < sStack_32a),
                      CONCAT16((0 < sStack_32c) * (sStack_32c < 0x100) * auVar63[0xc] -
                               (0xff < sStack_32c),
                               CONCAT15((0 < sStack_32e) * (sStack_32e < 0x100) * auVar63[10] -
                                        (0xff < sStack_32e),
                                        CONCAT14((0 < sStack_330) * (sStack_330 < 0x100) *
                                                 auVar63[8] - (0xff < sStack_330),
                                                 CONCAT13((0 < sStack_332) * (sStack_332 < 0x100) *
                                                          auVar63[6] - (0xff < sStack_332),
                                                          CONCAT12((0 < sStack_334) *
                                                                   (sStack_334 < 0x100) * auVar63[4]
                                                                   - (0xff < sStack_334),
                                                                   CONCAT11((0 < sStack_336) *
                                                                            (sStack_336 < 0x100) *
                                                                            auVar63[2] -
                                                                            (0xff < sStack_336),
                                                                            (0 < local_338) *
                                                                            (local_338 < 0x100) *
                                                                            auVar63[0] -
                                                                            (0xff < local_338)))))))
                     );
        local_1614 = local_1614 + 8;
      }
      local_1360 = local_1360 + in_EDX;
      local_1368 = local_1368 + in_ECX;
    }
  }
  else {
    for (local_1380 = 0; local_1380 < (int)(in_R9D - 1); local_1380 = local_1380 + 2) {
      local_1618 = 0;
      for (local_1384 = 0; local_1384 < (int)in_stack_00000008; local_1384 = local_1384 + 4) {
        pauVar1 = (undefined1 (*) [16])(local_1360 + -3 + (long)local_1618);
        uVar2 = *(undefined8 *)*pauVar1;
        auVar63 = *pauVar1;
        pauVar1 = (undefined1 (*) [16])((long)local_1618 + -3 + local_1360 + in_EDX);
        uVar3 = *(undefined8 *)*pauVar1;
        auVar64 = *pauVar1;
        local_f38 = (undefined1)uVar2;
        uStack_f37 = (undefined1)((ulong)uVar2 >> 8);
        uStack_f36 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_f35 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_f34 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_f33 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_f32 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_f31 = (undefined1)((ulong)uVar2 >> 0x38);
        local_f48 = auVar63[1];
        uStack_f47 = auVar63[2];
        uStack_f46 = auVar63[3];
        uStack_f45 = auVar63[4];
        uStack_f44 = auVar63[5];
        uStack_f43 = auVar63[6];
        uStack_f42 = auVar63[7];
        uStack_f41 = auVar63[8];
        auVar18[1] = local_f48;
        auVar18[0] = local_f38;
        auVar18[2] = uStack_f37;
        auVar18[3] = uStack_f47;
        auVar18[4] = uStack_f36;
        auVar18[5] = uStack_f46;
        auVar18[6] = uStack_f35;
        auVar18[7] = uStack_f45;
        auVar18[9] = uStack_f44;
        auVar18[8] = uStack_f34;
        auVar18[10] = uStack_f33;
        auVar18[0xb] = uStack_f43;
        auVar18[0xc] = uStack_f32;
        auVar18[0xd] = uStack_f42;
        auVar18[0xe] = uStack_f31;
        auVar18[0xf] = uStack_f41;
        auVar60 = pmaddubsw(auVar18,auVar56);
        uStack_f51 = auVar63[9];
        uStack_f61 = auVar63[10];
        auVar17[2] = uStack_f46;
        auVar17._0_2_ = auVar63._2_2_;
        auVar17[3] = uStack_f45;
        auVar17[4] = uStack_f45;
        auVar17[5] = uStack_f44;
        auVar17[6] = uStack_f44;
        auVar17[7] = uStack_f43;
        auVar17[10] = uStack_f42;
        auVar17._8_2_ = auVar63._6_2_;
        auVar17[0xb] = uStack_f41;
        auVar17[0xc] = uStack_f41;
        auVar17[0xd] = uStack_f51;
        auVar17[0xe] = uStack_f51;
        auVar17[0xf] = uStack_f61;
        auVar61 = pmaddubsw(auVar17,auVar57);
        uStack_f71 = auVar63[0xb];
        uStack_f81 = auVar63[0xc];
        auVar16[2] = uStack_f44;
        auVar16._0_2_ = auVar63._4_2_;
        auVar16[3] = uStack_f43;
        auVar16[4] = uStack_f43;
        auVar16[5] = uStack_f42;
        auVar16[6] = uStack_f42;
        auVar16[7] = uStack_f41;
        auVar16[10] = uStack_f51;
        auVar16._8_2_ = auVar63._8_2_;
        auVar16[0xb] = uStack_f61;
        auVar16[0xc] = uStack_f61;
        auVar16[0xd] = uStack_f71;
        auVar16[0xe] = uStack_f71;
        auVar16[0xf] = uStack_f81;
        auVar62 = pmaddubsw(auVar16,auVar58);
        uStack_f91 = auVar63[0xd];
        uStack_fa1 = auVar63[0xe];
        auVar15[2] = uStack_f42;
        auVar15._0_2_ = auVar63._6_2_;
        auVar15[3] = uStack_f41;
        auVar15[4] = uStack_f41;
        auVar15[5] = uStack_f51;
        auVar15[6] = uStack_f51;
        auVar15[7] = uStack_f61;
        auVar15[10] = uStack_f71;
        auVar15._8_2_ = auVar63._10_2_;
        auVar15[0xb] = uStack_f81;
        auVar15[0xc] = uStack_f81;
        auVar15[0xd] = uStack_f91;
        auVar15[0xe] = uStack_f91;
        auVar15[0xf] = uStack_fa1;
        auVar63 = pmaddubsw(auVar15,auVar59);
        local_798 = auVar60._0_2_;
        sStack_796 = auVar60._2_2_;
        sStack_794 = auVar60._4_2_;
        sStack_792 = auVar60._6_2_;
        sStack_790 = auVar60._8_2_;
        sStack_78e = auVar60._10_2_;
        sStack_78c = auVar60._12_2_;
        sStack_78a = auVar60._14_2_;
        local_7a8 = auVar61._0_2_;
        sStack_7a6 = auVar61._2_2_;
        sStack_7a4 = auVar61._4_2_;
        sStack_7a2 = auVar61._6_2_;
        sStack_7a0 = auVar61._8_2_;
        sStack_79e = auVar61._10_2_;
        sStack_79c = auVar61._12_2_;
        sStack_79a = auVar61._14_2_;
        uStack_14d6 = (undefined1)(sStack_796 + sStack_7a6);
        uStack_14d5 = (undefined1)((ushort)(sStack_796 + sStack_7a6) >> 8);
        uStack_14d4 = (undefined1)(sStack_794 + sStack_7a4);
        uStack_14d3 = (undefined1)((ushort)(sStack_794 + sStack_7a4) >> 8);
        uStack_14d2 = (undefined1)(sStack_792 + sStack_7a2);
        uStack_14d1 = (undefined1)((ushort)(sStack_792 + sStack_7a2) >> 8);
        uStack_14ce = (undefined1)(sStack_78e + sStack_79e);
        uStack_14cd = (undefined1)((ushort)(sStack_78e + sStack_79e) >> 8);
        uStack_14cc = (undefined1)(sStack_78c + sStack_79c);
        uStack_14cb = (undefined1)((ushort)(sStack_78c + sStack_79c) >> 8);
        uStack_14ca = (undefined1)(sStack_78a + sStack_79a);
        uStack_14c9 = (undefined1)((ushort)(sStack_78a + sStack_79a) >> 8);
        local_7b8 = auVar62._0_2_;
        sStack_7b6 = auVar62._2_2_;
        sStack_7b4 = auVar62._4_2_;
        sStack_7b2 = auVar62._6_2_;
        sStack_7b0 = auVar62._8_2_;
        sStack_7ae = auVar62._10_2_;
        sStack_7ac = auVar62._12_2_;
        sStack_7aa = auVar62._14_2_;
        local_7c8 = auVar63._0_2_;
        sStack_7c6 = auVar63._2_2_;
        sStack_7c4 = auVar63._4_2_;
        sStack_7c2 = auVar63._6_2_;
        sStack_7c0 = auVar63._8_2_;
        sStack_7be = auVar63._10_2_;
        sStack_7bc = auVar63._12_2_;
        sStack_7ba = auVar63._14_2_;
        uVar4 = CONCAT13(uStack_14d5,CONCAT12(uStack_14d6,local_798 + local_7a8));
        uVar5 = CONCAT15(uStack_14d3,CONCAT14(uStack_14d4,uVar4));
        uVar6 = CONCAT13(uStack_14cd,CONCAT12(uStack_14ce,sStack_790 + sStack_7a0));
        uVar7 = CONCAT15(uStack_14cb,CONCAT14(uStack_14cc,uVar6));
        sStack_7d6 = (short)((uint)uVar4 >> 0x10);
        sStack_7d4 = (short)((uint6)uVar5 >> 0x20);
        sStack_7d2 = (short)(CONCAT17(uStack_14d1,CONCAT16(uStack_14d2,uVar5)) >> 0x30);
        sStack_7ce = (short)((uint)uVar6 >> 0x10);
        sStack_7cc = (short)((uint6)uVar7 >> 0x20);
        sStack_7ca = (short)(CONCAT17(uStack_14c9,CONCAT16(uStack_14ca,uVar7)) >> 0x30);
        sStack_7d6 = sStack_7d6 + sStack_7b6 + sStack_7c6;
        sStack_7d4 = sStack_7d4 + sStack_7b4 + sStack_7c4;
        sStack_7d2 = sStack_7d2 + sStack_7b2 + sStack_7c2;
        sStack_7ce = sStack_7ce + sStack_7ae + sStack_7be;
        sStack_7cc = sStack_7cc + sStack_7ac + sStack_7bc;
        sStack_7ca = sStack_7ca + sStack_7aa + sStack_7ba;
        uStack_14d6 = (undefined1)sStack_7d6;
        uStack_14d5 = (undefined1)((ushort)sStack_7d6 >> 8);
        uStack_14d4 = (undefined1)sStack_7d4;
        uStack_14d3 = (undefined1)((ushort)sStack_7d4 >> 8);
        uStack_14d2 = (undefined1)sStack_7d2;
        uStack_14d1 = (undefined1)((ushort)sStack_7d2 >> 8);
        uStack_14ce = (undefined1)sStack_7ce;
        uStack_14cd = (undefined1)((ushort)sStack_7ce >> 8);
        uStack_14cc = (undefined1)sStack_7cc;
        uStack_14cb = (undefined1)((ushort)sStack_7cc >> 8);
        uStack_14ca = (undefined1)sStack_7ca;
        uStack_14c9 = (undefined1)((ushort)sStack_7ca >> 8);
        auVar44[2] = uStack_14d6;
        auVar44._0_2_ = local_798 + local_7a8 + local_7b8 + local_7c8;
        auVar44[3] = uStack_14d5;
        auVar44[4] = uStack_14d4;
        auVar44[5] = uStack_14d3;
        auVar44[6] = uStack_14d2;
        auVar44[7] = uStack_14d1;
        auVar44[10] = uStack_14ce;
        auVar44._8_2_ = sStack_790 + sStack_7a0 + sStack_7b0 + sStack_7c0;
        auVar44[0xb] = uStack_14cd;
        auVar44[0xc] = uStack_14cc;
        auVar44[0xd] = uStack_14cb;
        auVar44[0xe] = uStack_14ca;
        auVar44[0xf] = uStack_14c9;
        auVar43._8_8_ = 0x20002000200020;
        auVar43._0_8_ = 0x20002000200020;
        auVar63 = paddsw(auVar44,auVar43);
        auVar63 = psraw(auVar63,ZEXT416(6));
        local_358 = auVar63._0_2_;
        sStack_356 = auVar63._2_2_;
        sStack_354 = auVar63._4_2_;
        sStack_352 = auVar63._6_2_;
        uVar55 = *(ulong *)(local_1368 + local_1618) & 0xffffffff00000000;
        uStack_14d4 = (undefined1)(uVar55 >> 0x20);
        uStack_14d3 = (undefined1)(uVar55 >> 0x28);
        uStack_14d2 = (undefined1)(uVar55 >> 0x30);
        uStack_14d1 = (undefined1)(uVar55 >> 0x38);
        *(ulong *)(local_1368 + local_1618) =
             CONCAT17(uStack_14d1,
                      CONCAT16(uStack_14d2,
                               CONCAT15(uStack_14d3,
                                        CONCAT14(uStack_14d4,
                                                 CONCAT13((0 < sStack_352) * (sStack_352 < 0x100) *
                                                          auVar63[6] - (0xff < sStack_352),
                                                          CONCAT12((0 < sStack_354) *
                                                                   (sStack_354 < 0x100) * auVar63[4]
                                                                   - (0xff < sStack_354),
                                                                   CONCAT11((0 < sStack_356) *
                                                                            (sStack_356 < 0x100) *
                                                                            auVar63[2] -
                                                                            (0xff < sStack_356),
                                                                            (0 < local_358) *
                                                                            (local_358 < 0x100) *
                                                                            auVar63[0] -
                                                                            (0xff < local_358)))))))
                     );
        local_fb8 = (undefined1)uVar3;
        uStack_fb7 = (undefined1)((ulong)uVar3 >> 8);
        uStack_fb6 = (undefined1)((ulong)uVar3 >> 0x10);
        uStack_fb5 = (undefined1)((ulong)uVar3 >> 0x18);
        uStack_fb4 = (undefined1)((ulong)uVar3 >> 0x20);
        uStack_fb3 = (undefined1)((ulong)uVar3 >> 0x28);
        uStack_fb2 = (undefined1)((ulong)uVar3 >> 0x30);
        uStack_fb1 = (undefined1)((ulong)uVar3 >> 0x38);
        local_fc8 = auVar64[1];
        uStack_fc7 = auVar64[2];
        uStack_fc6 = auVar64[3];
        uStack_fc5 = auVar64[4];
        uStack_fc4 = auVar64[5];
        uStack_fc3 = auVar64[6];
        uStack_fc2 = auVar64[7];
        uStack_fc1 = auVar64[8];
        auVar14[1] = local_fc8;
        auVar14[0] = local_fb8;
        auVar14[2] = uStack_fb7;
        auVar14[3] = uStack_fc7;
        auVar14[4] = uStack_fb6;
        auVar14[5] = uStack_fc6;
        auVar14[6] = uStack_fb5;
        auVar14[7] = uStack_fc5;
        auVar14[9] = uStack_fc4;
        auVar14[8] = uStack_fb4;
        auVar14[10] = uStack_fb3;
        auVar14[0xb] = uStack_fc3;
        auVar14[0xc] = uStack_fb2;
        auVar14[0xd] = uStack_fc2;
        auVar14[0xe] = uStack_fb1;
        auVar14[0xf] = uStack_fc1;
        auVar63 = pmaddubsw(auVar14,auVar56);
        uStack_fd1 = auVar64[9];
        uStack_fe1 = auVar64[10];
        auVar13[2] = uStack_fc6;
        auVar13._0_2_ = auVar64._2_2_;
        auVar13[3] = uStack_fc5;
        auVar13[4] = uStack_fc5;
        auVar13[5] = uStack_fc4;
        auVar13[6] = uStack_fc4;
        auVar13[7] = uStack_fc3;
        auVar13[10] = uStack_fc2;
        auVar13._8_2_ = auVar64._6_2_;
        auVar13[0xb] = uStack_fc1;
        auVar13[0xc] = uStack_fc1;
        auVar13[0xd] = uStack_fd1;
        auVar13[0xe] = uStack_fd1;
        auVar13[0xf] = uStack_fe1;
        auVar60 = pmaddubsw(auVar13,auVar57);
        uStack_ff1 = auVar64[0xb];
        uStack_1001 = auVar64[0xc];
        auVar12[2] = uStack_fc4;
        auVar12._0_2_ = auVar64._4_2_;
        auVar12[3] = uStack_fc3;
        auVar12[4] = uStack_fc3;
        auVar12[5] = uStack_fc2;
        auVar12[6] = uStack_fc2;
        auVar12[7] = uStack_fc1;
        auVar12[10] = uStack_fd1;
        auVar12._8_2_ = auVar64._8_2_;
        auVar12[0xb] = uStack_fe1;
        auVar12[0xc] = uStack_fe1;
        auVar12[0xd] = uStack_ff1;
        auVar12[0xe] = uStack_ff1;
        auVar12[0xf] = uStack_1001;
        auVar61 = pmaddubsw(auVar12,auVar58);
        uStack_1011 = auVar64[0xd];
        uStack_1021 = auVar64[0xe];
        auVar62[2] = uStack_fc2;
        auVar62._0_2_ = auVar64._6_2_;
        auVar62[3] = uStack_fc1;
        auVar62[4] = uStack_fc1;
        auVar62[5] = uStack_fd1;
        auVar62[6] = uStack_fd1;
        auVar62[7] = uStack_fe1;
        auVar62[10] = uStack_ff1;
        auVar62._8_2_ = auVar64._10_2_;
        auVar62[0xb] = uStack_1001;
        auVar62[0xc] = uStack_1001;
        auVar62[0xd] = uStack_1011;
        auVar62[0xe] = uStack_1011;
        auVar62[0xf] = uStack_1021;
        auVar64 = pmaddubsw(auVar62,auVar59);
        local_7f8 = auVar63._0_2_;
        sStack_7f6 = auVar63._2_2_;
        sStack_7f4 = auVar63._4_2_;
        sStack_7f2 = auVar63._6_2_;
        sStack_7f0 = auVar63._8_2_;
        sStack_7ee = auVar63._10_2_;
        sStack_7ec = auVar63._12_2_;
        sStack_7ea = auVar63._14_2_;
        local_808 = auVar60._0_2_;
        sStack_806 = auVar60._2_2_;
        sStack_804 = auVar60._4_2_;
        sStack_802 = auVar60._6_2_;
        sStack_800 = auVar60._8_2_;
        sStack_7fe = auVar60._10_2_;
        sStack_7fc = auVar60._12_2_;
        sStack_7fa = auVar60._14_2_;
        local_818 = auVar61._0_2_;
        sStack_816 = auVar61._2_2_;
        sStack_814 = auVar61._4_2_;
        sStack_812 = auVar61._6_2_;
        sStack_810 = auVar61._8_2_;
        sStack_80e = auVar61._10_2_;
        sStack_80c = auVar61._12_2_;
        sStack_80a = auVar61._14_2_;
        local_828 = auVar64._0_2_;
        sStack_826 = auVar64._2_2_;
        sStack_824 = auVar64._4_2_;
        sStack_822 = auVar64._6_2_;
        sStack_820 = auVar64._8_2_;
        sStack_81e = auVar64._10_2_;
        sStack_81c = auVar64._12_2_;
        sStack_81a = auVar64._14_2_;
        local_1558._0_4_ =
             CONCAT22(sStack_7f6 + sStack_806 + sStack_816 + sStack_826,
                      local_7f8 + local_808 + local_818 + local_828);
        local_1558._0_6_ =
             CONCAT24(sStack_7f4 + sStack_804 + sStack_814 + sStack_824,(uint)local_1558);
        local_1558 = CONCAT26(sStack_7f2 + sStack_802 + sStack_812 + sStack_822,
                              (undefined6)local_1558);
        uStack_1550._0_2_ = sStack_7f0 + sStack_800 + sStack_810 + sStack_820;
        uStack_1550._2_2_ = sStack_7ee + sStack_7fe + sStack_80e + sStack_81e;
        uStack_1550._4_2_ = sStack_7ec + sStack_7fc + sStack_80c + sStack_81c;
        uStack_1550._6_2_ = sStack_7ea + sStack_7fa + sStack_80a + sStack_81a;
        auVar42._8_8_ = uStack_1550;
        auVar42._0_8_ = local_1558;
        auVar41._8_8_ = 0x20002000200020;
        auVar41._0_8_ = 0x20002000200020;
        auVar63 = paddsw(auVar42,auVar41);
        auVar63 = psraw(auVar63,ZEXT416(6));
        local_378 = auVar63._0_2_;
        sStack_376 = auVar63._2_2_;
        sStack_374 = auVar63._4_2_;
        sStack_372 = auVar63._6_2_;
        local_1558._0_2_ =
             CONCAT11((0 < sStack_376) * (sStack_376 < 0x100) * auVar63[2] - (0xff < sStack_376),
                      (0 < local_378) * (local_378 < 0x100) * auVar63[0] - (0xff < local_378));
        local_1558._0_3_ =
             CONCAT12((0 < sStack_374) * (sStack_374 < 0x100) * auVar63[4] - (0xff < sStack_374),
                      (undefined2)local_1558);
        local_1558._0_4_ =
             CONCAT13((0 < sStack_372) * (sStack_372 < 0x100) * auVar63[6] - (0xff < sStack_372),
                      (undefined3)local_1558);
        *(ulong *)(local_1368 + in_ECX + (long)local_1618) =
             (ulong)(uint)local_1558 |
             *(ulong *)(local_1368 + in_ECX + (long)local_1618) & 0xffffffff00000000;
        local_1618 = local_1618 + 4;
      }
      local_1360 = local_1360 + (in_EDX << 1);
      local_1368 = local_1368 + (in_ECX << 1);
    }
    local_161c = 0;
    for (local_1384 = 0; local_1384 < (int)in_stack_00000008; local_1384 = local_1384 + 4) {
      pauVar1 = (undefined1 (*) [16])(local_1360 + -3 + (long)local_161c);
      uVar2 = *(undefined8 *)*pauVar1;
      auVar63 = *pauVar1;
      local_1038 = (undefined1)uVar2;
      uStack_1037 = (undefined1)((ulong)uVar2 >> 8);
      uStack_1036 = (undefined1)((ulong)uVar2 >> 0x10);
      uStack_1035 = (undefined1)((ulong)uVar2 >> 0x18);
      uStack_1034 = (undefined1)((ulong)uVar2 >> 0x20);
      uStack_1033 = (undefined1)((ulong)uVar2 >> 0x28);
      uStack_1032 = (undefined1)((ulong)uVar2 >> 0x30);
      uStack_1031 = (undefined1)((ulong)uVar2 >> 0x38);
      local_1048 = auVar63[1];
      uStack_1047 = auVar63[2];
      uStack_1046 = auVar63[3];
      uStack_1045 = auVar63[4];
      uStack_1044 = auVar63[5];
      uStack_1043 = auVar63[6];
      uStack_1042 = auVar63[7];
      uStack_1041 = auVar63[8];
      auVar11[1] = local_1048;
      auVar11[0] = local_1038;
      auVar11[2] = uStack_1037;
      auVar11[3] = uStack_1047;
      auVar11[4] = uStack_1036;
      auVar11[5] = uStack_1046;
      auVar11[6] = uStack_1035;
      auVar11[7] = uStack_1045;
      auVar11[9] = uStack_1044;
      auVar11[8] = uStack_1034;
      auVar11[10] = uStack_1033;
      auVar11[0xb] = uStack_1043;
      auVar11[0xc] = uStack_1032;
      auVar11[0xd] = uStack_1042;
      auVar11[0xe] = uStack_1031;
      auVar11[0xf] = uStack_1041;
      auVar64 = pmaddubsw(auVar11,auVar56);
      uStack_1051 = auVar63[9];
      uStack_1061 = auVar63[10];
      auVar10[2] = uStack_1046;
      auVar10._0_2_ = auVar63._2_2_;
      auVar10[3] = uStack_1045;
      auVar10[4] = uStack_1045;
      auVar10[5] = uStack_1044;
      auVar10[6] = uStack_1044;
      auVar10[7] = uStack_1043;
      auVar10[10] = uStack_1042;
      auVar10._8_2_ = auVar63._6_2_;
      auVar10[0xb] = uStack_1041;
      auVar10[0xc] = uStack_1041;
      auVar10[0xd] = uStack_1051;
      auVar10[0xe] = uStack_1051;
      auVar10[0xf] = uStack_1061;
      auVar60 = pmaddubsw(auVar10,auVar57);
      uStack_1071 = auVar63[0xb];
      uStack_1081 = auVar63[0xc];
      auVar9[2] = uStack_1044;
      auVar9._0_2_ = auVar63._4_2_;
      auVar9[3] = uStack_1043;
      auVar9[4] = uStack_1043;
      auVar9[5] = uStack_1042;
      auVar9[6] = uStack_1042;
      auVar9[7] = uStack_1041;
      auVar9[10] = uStack_1051;
      auVar9._8_2_ = auVar63._8_2_;
      auVar9[0xb] = uStack_1061;
      auVar9[0xc] = uStack_1061;
      auVar9[0xd] = uStack_1071;
      auVar9[0xe] = uStack_1071;
      auVar9[0xf] = uStack_1081;
      auVar61 = pmaddubsw(auVar9,auVar58);
      uStack_1091 = auVar63[0xd];
      uStack_10a1 = auVar63[0xe];
      auVar8[2] = uStack_1042;
      auVar8._0_2_ = auVar63._6_2_;
      auVar8[3] = uStack_1041;
      auVar8[4] = uStack_1041;
      auVar8[5] = uStack_1051;
      auVar8[6] = uStack_1051;
      auVar8[7] = uStack_1061;
      auVar8[10] = uStack_1071;
      auVar8._8_2_ = auVar63._10_2_;
      auVar8[0xb] = uStack_1081;
      auVar8[0xc] = uStack_1081;
      auVar8[0xd] = uStack_1091;
      auVar8[0xe] = uStack_1091;
      auVar8[0xf] = uStack_10a1;
      auVar63 = pmaddubsw(auVar8,auVar59);
      local_858 = auVar64._0_2_;
      sStack_856 = auVar64._2_2_;
      sStack_854 = auVar64._4_2_;
      sStack_852 = auVar64._6_2_;
      sStack_850 = auVar64._8_2_;
      sStack_84e = auVar64._10_2_;
      sStack_84c = auVar64._12_2_;
      sStack_84a = auVar64._14_2_;
      local_868 = auVar60._0_2_;
      sStack_866 = auVar60._2_2_;
      sStack_864 = auVar60._4_2_;
      sStack_862 = auVar60._6_2_;
      sStack_860 = auVar60._8_2_;
      sStack_85e = auVar60._10_2_;
      sStack_85c = auVar60._12_2_;
      sStack_85a = auVar60._14_2_;
      uStack_14d6 = (undefined1)(sStack_856 + sStack_866);
      uStack_14d5 = (undefined1)((ushort)(sStack_856 + sStack_866) >> 8);
      uStack_14d4 = (undefined1)(sStack_854 + sStack_864);
      uStack_14d3 = (undefined1)((ushort)(sStack_854 + sStack_864) >> 8);
      uStack_14d2 = (undefined1)(sStack_852 + sStack_862);
      uStack_14d1 = (undefined1)((ushort)(sStack_852 + sStack_862) >> 8);
      uStack_14ce = (undefined1)(sStack_84e + sStack_85e);
      uStack_14cd = (undefined1)((ushort)(sStack_84e + sStack_85e) >> 8);
      uStack_14cc = (undefined1)(sStack_84c + sStack_85c);
      uStack_14cb = (undefined1)((ushort)(sStack_84c + sStack_85c) >> 8);
      uStack_14ca = (undefined1)(sStack_84a + sStack_85a);
      uStack_14c9 = (undefined1)((ushort)(sStack_84a + sStack_85a) >> 8);
      local_878 = auVar61._0_2_;
      sStack_876 = auVar61._2_2_;
      sStack_874 = auVar61._4_2_;
      sStack_872 = auVar61._6_2_;
      sStack_870 = auVar61._8_2_;
      sStack_86e = auVar61._10_2_;
      sStack_86c = auVar61._12_2_;
      sStack_86a = auVar61._14_2_;
      local_888 = auVar63._0_2_;
      sStack_886 = auVar63._2_2_;
      sStack_884 = auVar63._4_2_;
      sStack_882 = auVar63._6_2_;
      sStack_880 = auVar63._8_2_;
      sStack_87e = auVar63._10_2_;
      sStack_87c = auVar63._12_2_;
      sStack_87a = auVar63._14_2_;
      uVar4 = CONCAT13(uStack_14d5,CONCAT12(uStack_14d6,local_858 + local_868));
      uVar5 = CONCAT15(uStack_14d3,CONCAT14(uStack_14d4,uVar4));
      uVar6 = CONCAT13(uStack_14cd,CONCAT12(uStack_14ce,sStack_850 + sStack_860));
      uVar7 = CONCAT15(uStack_14cb,CONCAT14(uStack_14cc,uVar6));
      sStack_896 = (short)((uint)uVar4 >> 0x10);
      sStack_894 = (short)((uint6)uVar5 >> 0x20);
      sStack_892 = (short)(CONCAT17(uStack_14d1,CONCAT16(uStack_14d2,uVar5)) >> 0x30);
      sStack_88e = (short)((uint)uVar6 >> 0x10);
      sStack_88c = (short)((uint6)uVar7 >> 0x20);
      sStack_88a = (short)(CONCAT17(uStack_14c9,CONCAT16(uStack_14ca,uVar7)) >> 0x30);
      sStack_896 = sStack_896 + sStack_876 + sStack_886;
      sStack_894 = sStack_894 + sStack_874 + sStack_884;
      sStack_892 = sStack_892 + sStack_872 + sStack_882;
      sStack_88e = sStack_88e + sStack_86e + sStack_87e;
      sStack_88c = sStack_88c + sStack_86c + sStack_87c;
      sStack_88a = sStack_88a + sStack_86a + sStack_87a;
      uStack_14d6 = (undefined1)sStack_896;
      uStack_14d5 = (undefined1)((ushort)sStack_896 >> 8);
      uStack_14d4 = (undefined1)sStack_894;
      uStack_14d3 = (undefined1)((ushort)sStack_894 >> 8);
      uStack_14d2 = (undefined1)sStack_892;
      uStack_14d1 = (undefined1)((ushort)sStack_892 >> 8);
      uStack_14ce = (undefined1)sStack_88e;
      uStack_14cd = (undefined1)((ushort)sStack_88e >> 8);
      uStack_14cc = (undefined1)sStack_88c;
      uStack_14cb = (undefined1)((ushort)sStack_88c >> 8);
      uStack_14ca = (undefined1)sStack_88a;
      uStack_14c9 = (undefined1)((ushort)sStack_88a >> 8);
      auVar40[2] = uStack_14d6;
      auVar40._0_2_ = local_858 + local_868 + local_878 + local_888;
      auVar40[3] = uStack_14d5;
      auVar40[4] = uStack_14d4;
      auVar40[5] = uStack_14d3;
      auVar40[6] = uStack_14d2;
      auVar40[7] = uStack_14d1;
      auVar40[10] = uStack_14ce;
      auVar40._8_2_ = sStack_850 + sStack_860 + sStack_870 + sStack_880;
      auVar40[0xb] = uStack_14cd;
      auVar40[0xc] = uStack_14cc;
      auVar40[0xd] = uStack_14cb;
      auVar40[0xe] = uStack_14ca;
      auVar40[0xf] = uStack_14c9;
      auVar39._8_8_ = 0x20002000200020;
      auVar39._0_8_ = 0x20002000200020;
      auVar63 = paddsw(auVar40,auVar39);
      auVar63 = psraw(auVar63,ZEXT416(6));
      local_398 = auVar63._0_2_;
      sStack_396 = auVar63._2_2_;
      sStack_394 = auVar63._4_2_;
      sStack_392 = auVar63._6_2_;
      uVar55 = *(ulong *)(local_1368 + local_161c) & 0xffffffff00000000;
      uStack_14d4 = (undefined1)(uVar55 >> 0x20);
      uStack_14d3 = (undefined1)(uVar55 >> 0x28);
      uStack_14d2 = (undefined1)(uVar55 >> 0x30);
      uStack_14d1 = (undefined1)(uVar55 >> 0x38);
      *(ulong *)(local_1368 + local_161c) =
           CONCAT17(uStack_14d1,
                    CONCAT16(uStack_14d2,
                             CONCAT15(uStack_14d3,
                                      CONCAT14(uStack_14d4,
                                               CONCAT13((0 < sStack_392) * (sStack_392 < 0x100) *
                                                        auVar63[6] - (0xff < sStack_392),
                                                        CONCAT12((0 < sStack_394) *
                                                                 (sStack_394 < 0x100) * auVar63[4] -
                                                                 (0xff < sStack_394),
                                                                 CONCAT11((0 < sStack_396) *
                                                                          (sStack_396 < 0x100) *
                                                                          auVar63[2] -
                                                                          (0xff < sStack_396),
                                                                          (0 < local_398) *
                                                                          (local_398 < 0x100) *
                                                                          auVar63[0] -
                                                                          (0xff < local_398))))))));
      local_161c = local_161c + 4;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *pu1_src,
                                      UWORD8 *pu1_dst,
                                      WORD32 src_strd,
                                      WORD32 dst_strd,
                                      WORD8 *pi1_coeff,
                                      WORD32 ht,
                                      WORD32 wd)
{
    WORD32 row, col;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b, res_temp8_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b, res_temp18_8x16b;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

    ASSERT(wd % 4 == 0); /* checking assumption*/

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    /* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);
    zero_8x16b = _mm_set1_epi32(0);
    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */

    mask_low_32b = _mm_cmpeq_epi16(zero_8x16b, zero_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_4_8x16b);  /* pi1_coeff[4] */

    if(0 == (ht & 1)) /* ht multiple of 2 case */
    {

        if(0 == (wd & 7)) /* wd = multiple of 8 case */
        {
            for(row = 0; row < ht; row += 2)
            {

                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from row 0*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));         /* row = 0 */

                    /*load 16 pixel values from row 1*/
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row =1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row =1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* pointer updates*/
                pu1_dst += 2 * dst_strd;  /* pointer updates*/
            }
        }
        else /* wd = multiple of 4 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
        }
    }
    else /* odd ht */
    {
        if(0 == (wd & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row++)
            {
                int offset = 0;


                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += src_strd;    /* pointer updates*/
                pu1_dst += dst_strd;    /* pointer updates*/
            }
        }
        else  /* wd = multiple of 4 case */
        {
            for(row = 0; row < (ht - 1); row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
            { /* last repeat at outside the loop */
                int offset = 0;
                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 4; /* To pointer updates*/
                }
            }
        }
    }
}